

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseGuidedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  char cVar1;
  UINT8 subtype;
  ushort uVar2;
  TreeModel *pTVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  UModelIndex *index_00;
  bool bVar8;
  __type _Var9;
  bool bVar10;
  UINT32 UVar11;
  undefined7 extraout_var;
  uLong uVar12;
  ulong uVar13;
  undefined7 extraout_var_00;
  ushort *puVar14;
  ushort uVar15;
  ushort *puVar16;
  CBString *this_00;
  uint uVar17;
  USTATUS UVar18;
  EFI_GUID *guid_00;
  UINT8 *ffsSize;
  bool bVar19;
  uint uVar20;
  byte local_1b0;
  uint local_19c;
  UByteArray local_198;
  ulong local_178;
  uint local_16c;
  UByteArray header;
  CBString additionalInfo;
  UByteArray baGuid;
  UByteArray body;
  EFI_GUID guid;
  CBString name;
  CBString local_b0;
  UModelIndex local_98;
  UModelIndex *local_80;
  UModelIndex parentVolumeIndex;
  CBString local_60;
  CBString info;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    return 0x14;
  }
  local_80 = index;
  TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
  if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
      (parentVolumeIndex.m == (TreeModel *)0x0)) ||
     (bVar8 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar8)) {
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
LAB_0011aa5e:
    guid._0_8_ = *(undefined8 *)(ffsSize + 4);
    guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0xc);
    puVar14 = (ushort *)(ffsSize + 0x14);
    puVar16 = (ushort *)(ffsSize + 0x16);
    uVar17 = (uint)(section->d)._M_string_length;
    uVar20 = 0x18;
  }
  else {
    TreeModel::parsingData(&baGuid,this->model,&parentVolumeIndex);
    cVar1 = baGuid.d._M_dataplus._M_p[0x19];
    std::__cxx11::string::~string((string *)&baGuid);
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
    if ((cVar1 != '\x03') || (UVar11 = uint24ToUint32(ffsSize), UVar11 != 0xffffff))
    goto LAB_0011aa5e;
    uVar17 = (uint)(section->d)._M_string_length;
    if (uVar17 < 0x1c) {
      return 0x14;
    }
    guid._0_8_ = *(undefined8 *)(ffsSize + 8);
    guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0x10);
    puVar14 = (ushort *)(ffsSize + 0x18);
    puVar16 = (ushort *)(ffsSize + 0x1a);
    uVar20 = 0x1c;
  }
  if (uVar17 < uVar20) {
    return 0x14;
  }
  uVar15 = *puVar14;
  uVar2 = *puVar16;
  Bstrlib::CBString::CBString(&additionalInfo);
  UByteArray::UByteArray(&baGuid,(char *)&guid,0x10);
  _Var9 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_CRC32.d);
  if (_Var9) {
    local_178 = CONCAT44(local_178._4_4_,(int)CONCAT71(extraout_var,(uVar2 & 2) == 0));
    if ((uint)(section->d)._M_string_length < uVar20 + 4) goto LAB_0011aaed;
    uVar17 = *(uint *)((section->d)._M_dataplus._M_p + uVar20);
    Bstrlib::CBString::CBString((CBString *)&header,"\nChecksum type: CRC32");
    Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
    Bstrlib::CBString::~CBString((CBString *)&header);
    uVar12 = crc32(0,(uchar *)((section->d)._M_dataplus._M_p + uVar15),
                   (int)(section->d)._M_string_length - (uint)uVar15);
    if (uVar17 == (uint)uVar12) {
      usprintf((CBString *)&header,"\nChecksum: %08Xh, valid",(ulong)uVar17);
      Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
      Bstrlib::CBString::~CBString((CBString *)&header);
      bVar8 = false;
      goto LAB_0011acd3;
    }
    usprintf((CBString *)&header,"\nChecksum: %08Xh, invalid, should be %08Xh",(ulong)uVar17,
             uVar12 & 0xffffffff);
    Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
    Bstrlib::CBString::~CBString((CBString *)&header);
    bVar6 = true;
    bVar5 = false;
    bVar8 = false;
    uVar17 = 0;
    local_19c = (uint)uVar15;
LAB_0011acde:
    local_1b0 = 0;
LAB_0011acf5:
    bVar7 = false;
    bVar10 = false;
    bVar19 = false;
  }
  else {
    local_178 = (ulong)uVar20;
    _Var9 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_LZMA.d);
    local_19c = (uint)uVar15;
    if (((_Var9) || (_Var9 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_LZMA_HP.d), _Var9)) ||
       ((_Var9 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_LZMA_MS.d), _Var9 ||
        (((_Var9 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_LZMAF86.d), _Var9 ||
          (_Var9 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_TIANO.d), _Var9)) ||
         (_Var9 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_GZIP.d), _Var9)))))) {
      bVar8 = (uVar2 & 1) == 0;
      local_178 = local_178 & 0xffffffff00000000;
LAB_0011acd3:
      local_19c = (uint)uVar15;
      bVar5 = false;
      uVar17 = 0;
LAB_0011acd6:
      bVar6 = false;
      goto LAB_0011acde;
    }
    _Var9 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_ZLIB_AMD.d);
    if (!_Var9) {
      _Var9 = std::operator==(&baGuid.d,&EFI_CERT_TYPE_RSA2048_SHA256_GUID.d);
      if (_Var9) {
        uVar17 = (uint)CONCAT11((char)(uVar15 >> 8),(uVar2 & 1) == 0);
        if ((uint)(section->d)._M_string_length < uVar20 + 0x210) goto LAB_0011aaed;
        Bstrlib::CBString::CBString((CBString *)&header,"\nCertificate type: RSA2048/SHA256");
        Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
        local_19c = local_19c + 0x210;
        Bstrlib::CBString::~CBString((CBString *)&header);
        bVar5 = true;
        local_178 = local_178 & 0xffffffff00000000;
        bVar8 = false;
        goto LAB_0011acd6;
      }
      _Var9 = std::operator==(&baGuid.d,&EFI_FIRMWARE_CONTENTS_SIGNED_GUID.d);
      if (_Var9) {
        local_16c = (uint)CONCAT71(extraout_var_00,(uVar2 & 1) == 0);
        uVar17 = (uint)(section->d)._M_string_length;
        UVar18 = 0x14;
        if (uVar17 < uVar20 + 8) goto LAB_0011b16d;
        pcVar4 = (section->d)._M_dataplus._M_p;
        uVar15 = uVar15 + *(short *)(pcVar4 + local_178);
        local_19c = (uint)uVar15;
        UVar18 = 0x14;
        if (uVar17 < uVar15) goto LAB_0011b16d;
        if (*(short *)(pcVar4 + local_178 + 6) == 0xef1) {
          Bstrlib::CBString::CBString((CBString *)&header,"\nCertificate type: UEFI");
          Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
          Bstrlib::CBString::~CBString((CBString *)&header);
          guid_00 = (EFI_GUID *)((section->d)._M_dataplus._M_p + local_178 + 8);
          UByteArray::UByteArray(&header,(char *)guid_00,0x10);
          _Var9 = std::operator==(&header.d,&EFI_CERT_TYPE_RSA2048_SHA256_GUID.d);
          if (_Var9) {
            Bstrlib::CBString::CBString((CBString *)&body,"\nCertificate subtype: RSA2048/SHA256");
            Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&body);
            this_00 = (CBString *)&body;
          }
          else {
            Bstrlib::CBString::CBString
                      ((CBString *)&local_198,"\nCertificate subtype: unknown, GUID ");
            guidToUString(&name,guid_00,true);
            Bstrlib::CBString::operator+((CBString *)&body,(CBString *)&local_198,&name);
            Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&body);
            Bstrlib::CBString::~CBString((CBString *)&body);
            Bstrlib::CBString::~CBString(&name);
            this_00 = (CBString *)&local_198;
          }
          Bstrlib::CBString::~CBString(this_00);
          bVar10 = !_Var9;
          std::__cxx11::string::~string((string *)&header);
          bVar7 = false;
        }
        else {
          usprintf((CBString *)&header,"\nCertificate type: unknown (%04Xh)");
          Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
          Bstrlib::CBString::~CBString((CBString *)&header);
          bVar7 = true;
          bVar10 = false;
        }
        bVar5 = true;
        local_178 = local_178 & 0xffffffff00000000;
        bVar8 = false;
        bVar6 = false;
        local_1b0 = 0;
        bVar19 = false;
        uVar17 = local_16c;
        goto LAB_0011acfd;
      }
      local_1b0 = (byte)uVar2 & 1;
      bVar5 = false;
      local_178 = local_178 & 0xffffffff00000000;
      bVar8 = false;
      uVar17 = 0;
      bVar6 = false;
      goto LAB_0011acf5;
    }
    uVar13 = (ulong)(uint)(section->d)._M_string_length;
    if (uVar13 < local_178 + 0x100) {
LAB_0011aaed:
      UVar18 = 0x14;
      goto LAB_0011b16d;
    }
    bVar8 = (uVar2 & 1) == 0;
    bVar19 = local_178 + 0x100 + (ulong)*(uint *)((section->d)._M_dataplus._M_p + local_178 + 0x14)
             != uVar13;
    local_19c = uVar15 + 0x100;
    bVar5 = false;
    local_178 = local_178 & 0xffffffff00000000;
    bVar6 = false;
    bVar7 = false;
    bVar10 = false;
    local_1b0 = 0;
    uVar17 = 0;
  }
LAB_0011acfd:
  UByteArray::left(&header,section,local_19c & 0xffff);
  UByteArray::mid(&body,section,local_19c & 0xffff,-1);
  guidToUString(&name,&guid,true);
  Bstrlib::CBString::CBString((CBString *)&local_98,"Section GUID: ");
  guidToUString(&local_b0,&guid,false);
  Bstrlib::CBString::operator+((CBString *)&local_198,(CBString *)&local_98,&local_b0);
  uVar20 = (uint)(section->d)._M_string_length;
  usprintf(&local_60,
           "\nType: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nAttributes: %04Xh"
           ,(ulong)ffsSize[3],(ulong)uVar20,(ulong)uVar20,(ulong)(uint)header.d._M_string_length,
           (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
           (ulong)(uint)body.d._M_string_length,(ulong)uVar2);
  Bstrlib::CBString::operator+(&info,(CBString *)&local_198,&local_60);
  Bstrlib::CBString::~CBString(&local_60);
  Bstrlib::CBString::~CBString((CBString *)&local_198);
  Bstrlib::CBString::~CBString(&local_b0);
  Bstrlib::CBString::~CBString((CBString *)&local_98);
  Bstrlib::CBString::operator+=(&info,&additionalInfo);
  if (insertIntoTree) {
    pTVar3 = this->model;
    subtype = ffsSize[3];
    local_16c = uVar17;
    Bstrlib::CBString::CBString(&local_b0);
    local_198.d._M_dataplus._M_p = (pointer)&local_198.d.field_2;
    local_198.d._M_string_length = 0;
    local_198.d.field_2._M_local_buf[0] = '\0';
    TreeModel::addItem(&local_98,pTVar3,localOffset,'C',subtype,&name,&local_b0,&info,&header,&body,
                       &local_198,Movable,parent,'\0');
    index_00 = local_80;
    local_80->m = (TreeModel *)CONCAT44(local_98.m._4_4_,local_98.m._0_4_);
    local_80->r = local_98.r;
    local_80->c = local_98.c;
    local_80->i = local_98.i;
    std::__cxx11::string::~string((string *)&local_198);
    Bstrlib::CBString::~CBString(&local_b0);
    local_98.m._0_4_ = 0;
    local_98._0_8_ = guid._0_8_;
    local_98.i._0_1_ = guid.Data4[0];
    local_98.i._1_1_ = guid.Data4[1];
    local_98.i._2_1_ = guid.Data4[2];
    local_98.i._3_1_ = guid.Data4[3];
    local_98.i._4_1_ = guid.Data4[4];
    local_98.i._5_1_ = guid.Data4[5];
    local_98.i._6_1_ = guid.Data4[6];
    local_98.i._7_1_ = guid.Data4[7];
    pTVar3 = this->model;
    UByteArray::UByteArray(&local_198,(char *)&local_98,0x14);
    TreeModel::setParsingData(pTVar3,index_00,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    if (bVar5) {
      usprintf((CBString *)&local_198,
               "%s: GUIDed section signature may become invalid after modification",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_198,index_00);
      Bstrlib::CBString::~CBString((CBString *)&local_198);
    }
    if ((char)local_178 != '\0') {
      usprintf((CBString *)&local_198,"%s: CRC32 GUIDed section without AuthStatusValid attribute",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_198,index_00);
      Bstrlib::CBString::~CBString((CBString *)&local_198);
    }
    if (bVar8) {
      usprintf((CBString *)&local_198,
               "%s: compressed GUIDed section without ProcessingRequired attribute",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_198,index_00);
      Bstrlib::CBString::~CBString((CBString *)&local_198);
    }
    if ((char)local_16c != '\0') {
      usprintf((CBString *)&local_198,
               "%s: signed GUIDed section without ProcessingRequired attribute",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_198,index_00);
      Bstrlib::CBString::~CBString((CBString *)&local_198);
    }
    if (bVar6) {
      usprintf((CBString *)&local_198,"%s: CRC32 GUIDed section with invalid checksum",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_198,index_00);
      Bstrlib::CBString::~CBString((CBString *)&local_198);
    }
    if (bVar7) {
      usprintf((CBString *)&local_198,"%s: signed GUIDed section with unknown certificate type",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_198,index_00);
      Bstrlib::CBString::~CBString((CBString *)&local_198);
    }
    if (bVar10) {
      usprintf((CBString *)&local_198,"%s: signed GUIDed section with unknown certificate subtype",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_198,index_00);
      Bstrlib::CBString::~CBString((CBString *)&local_198);
    }
    if (local_1b0 != 0) {
      usprintf((CBString *)&local_198,
               "%s: processing required bit set for GUIDed section with unknown GUID",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_198,index_00);
      Bstrlib::CBString::~CBString((CBString *)&local_198);
    }
    if (bVar19) {
      usprintf((CBString *)&local_198,"%s: AMD Zlib-compressed section with invalid compressed size"
               ,"parseGuidedSectionHeader");
      msg(this,(CBString *)&local_198,index_00);
      Bstrlib::CBString::~CBString((CBString *)&local_198);
    }
  }
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  std::__cxx11::string::~string((string *)&body);
  std::__cxx11::string::~string((string *)&header);
  UVar18 = 0;
LAB_0011b16d:
  std::__cxx11::string::~string((string *)&baGuid);
  Bstrlib::CBString::~CBString(&additionalInfo);
  return UVar18;
}

Assistant:

USTATUS FfsParser::parseGuidedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    EFI_GUID guid;
    UINT16 dataOffset;
    UINT16 attributes;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_GUID_DEFINED_SECTION* guidDefinedSectionHeader = (const EFI_GUID_DEFINED_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_GUID_DEFINED_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_GUID_DEFINED_SECTION);
        guid = guidDefinedSectionHeader->SectionDefinitionGuid;
        dataOffset = guidDefinedSectionHeader->DataOffset;
        attributes = guidDefinedSectionHeader->Attributes;
    }
    else { // Normal section
        const EFI_GUID_DEFINED_SECTION* guidDefinedSectionHeader = (const EFI_GUID_DEFINED_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_GUID_DEFINED_SECTION);
        guid = guidDefinedSectionHeader->SectionDefinitionGuid;
        dataOffset = guidDefinedSectionHeader->DataOffset;
        attributes = guidDefinedSectionHeader->Attributes;
    }
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    // Check for special GUIDed sections
    UString additionalInfo;
    UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    bool msgSignedSectionFound = false;
    bool msgNoAuthStatusAttribute = false;
    bool msgNoProcessingRequiredAttributeCompressed = false;
    bool msgNoProcessingRequiredAttributeSigned = false;
    bool msgInvalidCrc = false;
    bool msgUnknownCertType = false;
    bool msgUnknownCertSubtype = false;
    bool msgProcessingRequiredAttributeOnUnknownGuidedSection = false;
    bool msgInvalidCompressedSize = false;
    if (baGuid == EFI_GUIDED_SECTION_CRC32) {
        if ((attributes & EFI_GUIDED_SECTION_AUTH_STATUS_VALID) == 0) { // Check that AuthStatusValid attribute is set on compressed GUIDed sections
            msgNoAuthStatusAttribute = true;
        }
        
        if ((UINT32)section.size() < headerSize + sizeof(UINT32))
            return U_INVALID_SECTION;
        
        UINT32 crc = *(UINT32*)(section.constData() + headerSize);
        additionalInfo += UString("\nChecksum type: CRC32");
        // Calculate CRC32 of section data
        UINT32 calculated = (UINT32)crc32(0, (const UINT8*)section.constData() + dataOffset, (uInt)(section.size() - dataOffset));
        if (crc == calculated) {
            additionalInfo += usprintf("\nChecksum: %08Xh, valid", crc);
        }
        else {
            additionalInfo += usprintf("\nChecksum: %08Xh, invalid, should be %08Xh", crc, calculated);
            msgInvalidCrc = true;
        }
        // No need to change dataOffset here
    }
    else if (baGuid == EFI_GUIDED_SECTION_LZMA
        || baGuid == EFI_GUIDED_SECTION_LZMA_HP
        || baGuid == EFI_GUIDED_SECTION_LZMA_MS
        || baGuid == EFI_GUIDED_SECTION_LZMAF86
        || baGuid == EFI_GUIDED_SECTION_TIANO
        || baGuid == EFI_GUIDED_SECTION_GZIP) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on compressed GUIDed sections
            msgNoProcessingRequiredAttributeCompressed = true;
        }
        // No need to change dataOffset here
    }
    else if (baGuid == EFI_GUIDED_SECTION_ZLIB_AMD) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on compressed GUIDed sections
            msgNoProcessingRequiredAttributeCompressed = true;
        }

        if ((UINT32)section.size() < headerSize + sizeof(EFI_AMD_ZLIB_SECTION_HEADER))
            return U_INVALID_SECTION;

        const EFI_AMD_ZLIB_SECTION_HEADER* amdZlibSectionHeader = (const EFI_AMD_ZLIB_SECTION_HEADER*)(section.constData() + headerSize);

        // Check the compressed size to be sane
        if ((UINT32)section.size() != headerSize + sizeof(EFI_AMD_ZLIB_SECTION_HEADER) + amdZlibSectionHeader->CompressedSize) {
            msgInvalidCompressedSize = true;
        }

        // Adjust dataOffset
        dataOffset += sizeof(EFI_AMD_ZLIB_SECTION_HEADER);
    }
    else if (baGuid == EFI_CERT_TYPE_RSA2048_SHA256_GUID) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on signed GUIDed sections
            msgNoProcessingRequiredAttributeSigned = true;
        }
        
        // Get certificate type and length
        if ((UINT32)section.size() < headerSize + sizeof(EFI_CERT_BLOCK_RSA2048_SHA256))
            return U_INVALID_SECTION;
        
        // Adjust dataOffset
        dataOffset += sizeof(EFI_CERT_BLOCK_RSA2048_SHA256);
        additionalInfo += UString("\nCertificate type: RSA2048/SHA256");
        msgSignedSectionFound = true;
    }
    else if (baGuid == EFI_FIRMWARE_CONTENTS_SIGNED_GUID) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on signed GUIDed sections
            msgNoProcessingRequiredAttributeSigned = true;
        }
        
        // Get certificate type and length
        if ((UINT32)section.size() < headerSize + sizeof(WIN_CERTIFICATE))
            return U_INVALID_SECTION;
        
        const WIN_CERTIFICATE* winCertificate = (const WIN_CERTIFICATE*)(section.constData() + headerSize);
        UINT32 certLength = winCertificate->Length;
        UINT16 certType = winCertificate->CertificateType;
        
        // Adjust dataOffset
        dataOffset += certLength;
        
        // Check section size once again
        if ((UINT32)section.size() < dataOffset)
            return U_INVALID_SECTION;
        
        // Check certificate type
        if (certType == WIN_CERT_TYPE_EFI_GUID) {
            additionalInfo += UString("\nCertificate type: UEFI");
            
            // Get certificate GUID
            const WIN_CERTIFICATE_UEFI_GUID* winCertificateUefiGuid = (const WIN_CERTIFICATE_UEFI_GUID*)(section.constData() + headerSize);
            UByteArray certTypeGuid((const char*)&winCertificateUefiGuid->CertType, sizeof(EFI_GUID));
            
            if (certTypeGuid == EFI_CERT_TYPE_RSA2048_SHA256_GUID) {
                additionalInfo += UString("\nCertificate subtype: RSA2048/SHA256");
            }
            else {
                additionalInfo += UString("\nCertificate subtype: unknown, GUID ") + guidToUString(winCertificateUefiGuid->CertType);
                msgUnknownCertSubtype = true;
            }
        }
        else {
            additionalInfo += usprintf("\nCertificate type: unknown (%04Xh)", certType);
            msgUnknownCertType = true;
        }
        msgSignedSectionFound = true;
    }
    // Check that ProcessingRequired attribute is not set on GUIDed sections with unknown GUID
    else if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == EFI_GUIDED_SECTION_PROCESSING_REQUIRED) {
        msgProcessingRequiredAttributeOnUnknownGuidedSection = true;
    }
    
    UByteArray header = section.left(dataOffset);
    UByteArray body = section.mid(dataOffset);
    
    // Get info
    UString name = guidToUString(guid);
    UString info = UString("Section GUID: ") + guidToUString(guid, false) +
    usprintf("\nType: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nAttributes: %04Xh",
             sectionHeader->Type,
             (UINT32)section.size(), (UINT32)section.size(),
             (UINT32)header.size(), (UINT32)header.size(),
             (UINT32)body.size(), (UINT32)body.size(),
             attributes);
    
    // Append additional info
    info += additionalInfo;
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, sectionHeader->Type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set parsing data
        GUIDED_SECTION_PARSING_DATA pdata = {};
        pdata.guid = guid;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
        
        // Show messages
        if (msgSignedSectionFound)
            msg(usprintf("%s: GUIDed section signature may become invalid after modification", __FUNCTION__), index);
        if (msgNoAuthStatusAttribute)
            msg(usprintf("%s: CRC32 GUIDed section without AuthStatusValid attribute", __FUNCTION__), index);
        if (msgNoProcessingRequiredAttributeCompressed)
            msg(usprintf("%s: compressed GUIDed section without ProcessingRequired attribute", __FUNCTION__), index);
        if (msgNoProcessingRequiredAttributeSigned)
            msg(usprintf("%s: signed GUIDed section without ProcessingRequired attribute", __FUNCTION__), index);
        if (msgInvalidCrc)
            msg(usprintf("%s: CRC32 GUIDed section with invalid checksum", __FUNCTION__), index);
        if (msgUnknownCertType)
            msg(usprintf("%s: signed GUIDed section with unknown certificate type", __FUNCTION__), index);
        if (msgUnknownCertSubtype)
            msg(usprintf("%s: signed GUIDed section with unknown certificate subtype", __FUNCTION__), index);
        if (msgProcessingRequiredAttributeOnUnknownGuidedSection)
            msg(usprintf("%s: processing required bit set for GUIDed section with unknown GUID", __FUNCTION__), index);
        if (msgInvalidCompressedSize)
            msg(usprintf("%s: AMD Zlib-compressed section with invalid compressed size", __FUNCTION__), index);
    }
    
    return U_SUCCESS;
}